

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O1

char * str_unescape(char *str)

{
  char cVar1;
  char *pcVar2;
  size_t __n;
  char *pcVar3;
  size_t len;
  char *pcVar4;
  char *__s;
  bool bVar5;
  
  pcVar4 = str;
  __s = str;
  do {
    if (*__s == '\0') {
      return str;
    }
    pcVar2 = strchr(__s,0x5c);
    if (pcVar2 < __s) {
      __n = strlen(__s);
      memmove(pcVar4,__s,__n);
      pcVar4[__n] = '\0';
      pcVar3 = __s;
    }
    else {
      memmove(pcVar4,__s,(long)pcVar2 - (long)__s);
      cVar1 = pcVar2[1];
      if (cVar1 == 't') {
        cVar1 = '\t';
      }
      else if (cVar1 == 'r') {
        cVar1 = '\r';
      }
      else if (cVar1 == 'n') {
        cVar1 = '\n';
      }
      pcVar4 = pcVar4 + ((long)pcVar2 - (long)__s);
      *pcVar4 = cVar1;
      pcVar4[1] = '\0';
      pcVar4 = pcVar4 + 1;
      pcVar3 = pcVar2 + 2;
    }
    bVar5 = __s <= pcVar2;
    __s = pcVar3;
  } while (bVar5);
  return str;
}

Assistant:

char *str_unescape(char *str) {
    char *read = str, *write = str;
    while (*read) {
        char * pos = strchr(read, '\\');
        if (pos >= read) {
            size_t len = (size_t)(pos - read);
            memmove(write, read, len);
            write += len;
            read += (len + 1);
            switch (read[0]) {
            case 'r':
                *write++ = '\r';
                break;
            case 'n':
                *write++ = '\n';
                break;
            case 't':
                *write++ = '\t';
                break;
            default: 
                *write++ = read[0];
            }
            *write = 0;
            ++read;
        }
        else {
            size_t len = strlen(read);
            memmove(write, read, len);
            write[len] = 0;
            break;
        }
    }
    return str;
}